

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphic.h
# Opt level: O1

void __thiscall
mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::compress
          (updates<const_mpt::convertable_*,_mpt::graphic::hint> *this,int mask)

{
  long *plVar1;
  updates<const_mpt::convertable_*,_mpt::graphic::hint> uVar2;
  long *plVar3;
  long lVar4;
  char cVar5;
  content *d;
  int *piVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  long *plVar10;
  ulong uVar11;
  long local_60;
  
  uVar2 = *this;
  if (uVar2 == (updates<const_mpt::convertable_*,_mpt::graphic::hint>)0x0) {
    local_60 = 0;
  }
  else {
    local_60 = 0;
    if (*(long *)((long)uVar2 + 8) == 0) {
      local_60 = (long)uVar2 + 0x20;
    }
  }
  if ((uVar2 == (updates<const_mpt::convertable_*,_mpt::graphic::hint>)0x0) ||
     (*(long *)((long)uVar2 + 8) != 0)) {
    uVar9 = 0;
  }
  else {
    uVar9 = *(ulong *)((long)uVar2 + 0x18) >> 4;
  }
  if (uVar9 != 0) {
    piVar6 = (int *)(local_60 + 0x1c);
    plVar10 = (long *)0x0;
    uVar8 = 0;
    do {
      plVar1 = (long *)(local_60 + uVar8 * 0x10);
      if (*(int *)(local_60 + 0xc + uVar8 * 0x10) == 0) {
        if (plVar10 == (long *)0x0) {
          plVar10 = plVar1;
        }
      }
      else {
        uVar11 = uVar8 + 1;
        if (uVar11 < uVar9) {
          piVar7 = piVar6;
          do {
            if (((*piVar7 != 0) && (*plVar1 == *(long *)(piVar7 + -3))) &&
               (cVar5 = mpt::graphic::hint::merge((hint *)(plVar1 + 1),(int)piVar7 + -4),
               cVar5 != '\0')) {
              *(int *)((long)plVar1 + 0xcU) = *(int *)((long)plVar1 + 0xcU) + *piVar7;
              *piVar7 = 0;
            }
            uVar11 = uVar11 + 1;
            piVar7 = piVar7 + 4;
          } while (uVar11 < uVar9);
        }
        if (plVar10 == (long *)0x0) {
          plVar10 = (long *)0x0;
        }
        else {
          lVar4 = plVar1[1];
          *plVar10 = *plVar1;
          plVar10[1] = lVar4;
          *(undefined4 *)((long)plVar1 + 0xc) = 0;
          plVar3 = plVar10;
          do {
            plVar10 = plVar3 + 2;
            if (plVar1 <= plVar10) break;
            piVar7 = (int *)((long)plVar3 + 0x1c);
            plVar3 = plVar10;
          } while (*piVar7 != 0);
        }
      }
      uVar8 = uVar8 + 1;
      piVar6 = piVar6 + 4;
    } while (uVar8 != uVar9);
  }
  if (*this == (updates<const_mpt::convertable_*,_mpt::graphic::hint>)0x0) {
    return;
  }
  mpt::array::content::set_length((ulong)*this);
  return;
}

Assistant:

void compress(int mask = 0) {
		element *u = 0, *c = static_cast<element *>(base());
		long len = 0;
		
		for (long i = 0, max = length(); i < max; ++i) {
			if (!c[i].used) {
				if (!u) u = c + i;
				continue;
			}
			for (long j = i + 1; j < max; ++j) {
				if (!c[j].used || c[i].data != c[j].data) {
					continue;
				}
				if (!c[i].hint.merge(c[j].hint, mask)) {
					continue;
				}
				c[i].used += c[j].used;
				c[j].invalidate();
			}
			++len;
			
			if (!u) {
				continue;
			}
			*u = c[i];
			c[i].invalidate();
			
			while (++u < c + i) {
				if (!u->used) {
					break;
				}
			}
		}
		content *d;
		if ((d = _buf.instance())) {
			d->set_length(len * sizeof(*c));
		}
	}